

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmMakefile *this_00;
  cmake *pcVar2;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  PolicyID id;
  uint uVar6;
  ulong uVar7;
  cmListFileBacktrace local_260;
  cmCommandContext local_220;
  string local_1f8;
  Snapshot local_1d8;
  Snapshot local_1c0;
  ostringstream w;
  
  (*this->_vptr_cmGlobalGenerator[0x23])();
  ProcessEvaluationFiles(this);
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar7)
    break;
    this->CurrentMakefile = ppcVar1[uVar7]->Makefile;
    (*ppcVar1[uVar7]->_vptr_cmLocalGenerator[2])();
    this_00 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7]->Makefile;
    std::__cxx11::string::string((string *)&w,"CMAKE_SKIP_INSTALL_RULES",(allocator *)&local_260);
    bVar3 = cmMakefile::IsOn(this_00,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
    if (!bVar3) {
      cmLocalGenerator::GenerateInstallRules
                ((this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar7]);
    }
    cmLocalGenerator::GenerateTestFiles
              ((this->LocalGenerators).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7]);
    cmake::UpdateProgress
              (this->CMakeInstance,"Generating",
               ((float)uVar7 + 1.0) /
               (float)(ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    uVar6 = uVar6 + 1;
  }
  this->CurrentMakefile = (cmMakefile *)0x0;
  GenerateCPackPropertiesFile(this);
  p_Var4 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header) {
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[6])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_260,(cmPolicies *)0x2a,id);
        poVar5 = std::operator<<((ostream *)&w,(string *)&local_260);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&local_260);
        std::operator<<((ostream *)&w,"MACOSX_RPATH is not specified for the following targets:\n");
        for (p_Var4 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var4 !=
            &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          poVar5 = std::operator<<((ostream *)&w," ");
          poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 1));
          std::operator<<(poVar5,"\n");
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmState::Snapshot::Snapshot(&local_1d8,(cmState *)0x0);
        local_220.Name._M_dataplus._M_p = (pointer)&local_220.Name.field_2;
        local_220.Name._M_string_length = 0;
        local_220.Name.field_2._M_local_buf[0] = '\0';
        local_220.Line = 0;
        snapshot.Position.Tree = local_1d8.Position.Tree;
        snapshot.State = local_1d8.State;
        snapshot.Position.Position = local_1d8.Position.Position;
        cmListFileBacktrace::cmListFileBacktrace(&local_260,snapshot,&local_220);
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1f8,&local_260,false);
        cmListFileBacktrace::~cmListFileBacktrace(&local_260);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
      return;
    }
    bVar3 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var4 + 2));
    if ((!bVar3) && (bVar3 = cmSystemTools::GetErrorOccuredFlag(), !bVar3)) break;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  pcVar2 = this->CMakeInstance;
  std::__cxx11::string::string
            ((string *)&local_220,"Could not write export file.",(allocator *)&local_1f8);
  cmState::Snapshot::Snapshot(&local_1c0,(cmState *)0x0);
  local_260.Context.Name._M_dataplus._M_p = (pointer)&local_260.Context.Name.field_2;
  local_260.Context.Name._M_string_length = 0;
  local_260.Context.Name.field_2._M_local_buf[0] = '\0';
  local_260.Context.Line = 0;
  snapshot_00.Position.Tree = local_1c0.Position.Tree;
  snapshot_00.State = local_1c0.State;
  snapshot_00.Position.Position = local_1c0.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&w,snapshot_00,&local_260.Context)
  ;
  cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_220.Name,(cmListFileBacktrace *)&w,false);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&w);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_220);
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if(!this->LocalGenerators[i]->GetMakefile()->IsOn(
      "CMAKE_SKIP_INSTALL_RULES"))
      {
      this->LocalGenerators[i]->GenerateInstallRules();
      }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress("Generating",
      (static_cast<float>(i)+1.0f)/
       static_cast<float>(this->LocalGenerators.size()));
    }
  this->SetCurrentMakefile(0);

  if(!this->GenerateCPackPropertiesFile())
    {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
    }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator
      it = this->BuildExportSets.begin(); it != this->BuildExportSets.end();
      ++it)
    {
    if (!it->second->GenerateImportFile()
        && !cmSystemTools::GetErrorOccuredFlag())
      {
      this->GetCMakeInstance()
          ->IssueMessage(cmake::FATAL_ERROR, "Could not write export file.");
      return;
      }
    }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != 0)
    {
    this->ExtraGenerator->Generate();
    }

  if(!this->CMP0042WarnTargets.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for(std::set<std::string>::iterator
      iter = this->CMP0042WarnTargets.begin();
      iter != this->CMP0042WarnTargets.end();
      ++iter)
      {
      w << " " << *iter << "\n";
      }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}